

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O0

void zsummer::log4z::GetProcessInfo(string *name,string *pid)

{
  bool bVar1;
  uint uVar2;
  string local_168 [32];
  long local_148;
  size_type pos;
  CLog4zFile local_130;
  CLog4zFile i;
  char buf [260];
  pid_t id;
  string *pid_local;
  string *name_local;
  
  std::__cxx11::string::operator=((string *)name,"MainLog");
  std::__cxx11::string::operator=((string *)pid,"0");
  uVar2 = getpid();
  sprintf((char *)&i,"/proc/%d/cmdline",(ulong)uVar2);
  CLog4zFile::CLog4zFile(&local_130);
  CLog4zFile::Open(&local_130,(char *)&i,"r");
  bVar1 = CLog4zFile::IsOpen(&local_130);
  if (bVar1) {
    bVar1 = CLog4zFile::ReadLine(&local_130,(char *)&i,0x103);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)name,(char *)&i);
    }
    CLog4zFile::Close(&local_130);
    local_148 = std::__cxx11::string::rfind((char *)name,0x13691b);
    if (local_148 != -1) {
      std::__cxx11::string::substr((ulong)local_168,(ulong)name);
      std::__cxx11::string::operator=((string *)name,local_168);
      std::__cxx11::string::~string(local_168);
    }
    sprintf((char *)&i,"%06d",(ulong)uVar2);
    std::__cxx11::string::operator=((string *)pid,(char *)&i);
    pos._0_4_ = 0;
  }
  else {
    pos._0_4_ = 1;
  }
  CLog4zFile::~CLog4zFile(&local_130);
  return;
}

Assistant:

void GetProcessInfo(std::string &name, std::string &pid)
{
	name = "MainLog";
	pid = "0";
#ifdef WIN32

	char buf[260] = {0};
	if (GetModuleFileNameA(NULL, buf, 259) > 0)
	{
		name = buf;
	}
	std::string::size_type pos = name.rfind("\\");
	if (pos != std::string::npos)
	{
		name = name.substr(pos+1, std::string::npos);
	}
	pos = name.rfind(".");
	if (pos != std::string::npos)
	{
		name = name.substr(0, pos-0);
	}
	DWORD pidd = GetCurrentProcessId();
	sprintf(buf, "%06d", pidd);
	pid = buf;
#else
	pid_t id = getpid();
	char buf[260];
	sprintf(buf, "/proc/%d/cmdline", (int)id);
	CLog4zFile i;
	i.Open(buf, "r");
	if (!i.IsOpen())
	{
		return ;
	}
	if (i.ReadLine(buf, 259))
	{
		name = buf;
	}
	i.Close();

	std::string::size_type pos = name.rfind("/");
	if (pos != std::string::npos)
	{
		name = name.substr(pos+1, std::string::npos);
	}
	sprintf(buf, "%06d", id);
	pid = buf;
#endif
}